

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_std.h
# Opt level: O0

double mp::ComputeValue<std::vector<double,std::allocator<double>>>
                 (QuadraticObjective *obj,vector<double,_std::allocator<double>_> *x)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  QuadraticObjective *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  double nlp;
  double qp;
  double linp;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  LinTerms *in_stack_00000090;
  undefined8 local_38;
  
  LinearObjective::GetLinTerms((LinearObjective *)in_RDI);
  LinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            (in_stack_00000090,in_stack_00000088);
  QuadraticObjective::GetQPTerms(in_RDI);
  QuadTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            ((QuadTerms *)nlp,in_stack_00000018);
  bVar1 = NLObjective::HasExpr(&in_RDI->super_NLObjective);
  if (bVar1) {
    iVar2 = NLObjective::ExprIndex(&in_RDI->super_NLObjective);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar2);
    local_38 = *pvVar3;
  }
  else {
    local_38 = 0.0;
  }
  return (double)in_ST0 + (double)in_ST1 + local_38;
}

Assistant:

double ComputeValue(
    const QuadraticObjective& obj, const VarVec& x) {
  double linp = obj.GetLinTerms().ComputeValue(x);
  double qp = obj.GetQPTerms().ComputeValue(x);
  double nlp = (obj.HasExpr() ? x[obj.ExprIndex()] : 0.0);
  return linp + qp + nlp;
}